

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O3

int __thiscall Patch::Node::copy(Node *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Point old_extent;
  Point new_extent;
  Text *pTVar1;
  long lVar2;
  uint32_t uVar3;
  Text *pTVar4;
  pointer *__ptr;
  _Head_base<0UL,_Text_*,_false> local_68;
  _Head_base<0UL,_Text_*,_false> local_60;
  Node *local_58;
  Point local_50;
  Node *local_48;
  Node *local_40;
  Point local_38;
  
  local_58 = (Node *)operator_new(0x50);
  local_40 = this->left;
  local_48 = this->right;
  old_extent = this->old_extent;
  new_extent = this->new_extent;
  local_50 = this->old_distance_from_left_ancestor;
  local_38 = this->new_distance_from_left_ancestor;
  pTVar1 = (this->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
           super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
           super__Head_base<0UL,_Text_*,_false>._M_head_impl;
  if (pTVar1 == (Text *)0x0) {
    pTVar4 = (Text *)0x0;
  }
  else {
    pTVar4 = (Text *)operator_new(0x38);
    (pTVar4->content)._M_dataplus._M_p = (pointer)&(pTVar4->content).field_2;
    lVar2 = *(long *)&(pTVar1->content)._M_dataplus;
    std::__cxx11::u16string::_M_construct<char16_t*>
              ((u16string *)pTVar4,lVar2,lVar2 + (pTVar1->content)._M_string_length * 2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&pTVar4->line_offsets,&pTVar1->line_offsets);
  }
  pTVar1 = (this->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
           super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
           super__Head_base<0UL,_Text_*,_false>._M_head_impl;
  local_68._M_head_impl = pTVar4;
  if (pTVar1 == (Text *)0x0) {
    pTVar4 = (Text *)0x0;
  }
  else {
    pTVar4 = (Text *)operator_new(0x38);
    (pTVar4->content)._M_dataplus._M_p = (pointer)&(pTVar4->content).field_2;
    lVar2 = *(long *)&(pTVar1->content)._M_dataplus;
    std::__cxx11::u16string::_M_construct<char16_t*>
              ((u16string *)pTVar4,lVar2,lVar2 + (pTVar1->content)._M_string_length * 2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&pTVar4->line_offsets,&pTVar1->line_offsets);
  }
  local_60._M_head_impl = pTVar4;
  Node(local_58,local_40,local_48,old_extent,new_extent,local_50,local_38,
       (unique_ptr<Text,_std::default_delete<Text>_> *)&local_68,
       (unique_ptr<Text,_std::default_delete<Text>_> *)&local_60,this->old_text_size_);
  if (local_60._M_head_impl != (Text *)0x0) {
    std::default_delete<Text>::operator()((default_delete<Text> *)&local_60,local_60._M_head_impl);
  }
  if (local_68._M_head_impl != (Text *)0x0) {
    std::default_delete<Text>::operator()((default_delete<Text> *)&local_68,local_68._M_head_impl);
  }
  uVar3 = this->new_subtree_text_size;
  local_58->old_subtree_text_size = this->old_subtree_text_size;
  local_58->new_subtree_text_size = uVar3;
  return (int)local_58;
}

Assistant:

Node *copy() {
    auto result = new Node{
      left,
      right,
      old_extent,
      new_extent,
      old_distance_from_left_ancestor,
      new_distance_from_left_ancestor,
      old_text ? unique_ptr<Text>(new Text(*old_text)) : nullptr,
      new_text ? unique_ptr<Text>(new Text(*new_text)) : nullptr,
      old_text_size_,
    };
    result->old_subtree_text_size = old_subtree_text_size;
    result->new_subtree_text_size = new_subtree_text_size;
    return result;
  }